

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dofhandler.cc
# Opt level: O0

void lf::assemble::PrintInfo(ostream *stream,DofHandler *dof_handler,uint ctrl)

{
  Entity *entity;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ostream *poVar5;
  element_type *peVar6;
  undefined4 extraout_var;
  reference ppEVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference plVar8;
  undefined4 extraout_var_02;
  Entity *e_1;
  gdof_idx_t dof_idx;
  gdof_idx_t int_dof;
  iterator __end7;
  iterator __begin7;
  span<const_long,_18446744073709551615UL> *__range7;
  span<const_long,_18446744073709551615UL> intdoflist;
  gdof_idx_t *dof;
  iterator __end6;
  iterator __begin6;
  span<const_long,_18446744073709551615UL> *__range6;
  span<const_long,_18446744073709551615UL> doflist;
  size_type no_dofs;
  glb_idx_t e_idx;
  Entity *e;
  iterator __end5;
  iterator __begin5;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range5;
  dim_t codim;
  undefined1 local_30 [4];
  size_type N_dofs;
  shared_ptr<const_lf::mesh::Mesh> mesh;
  uint ctrl_local;
  DofHandler *dof_handler_local;
  ostream *stream_local;
  
  mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
       = ctrl;
  (*dof_handler->_vptr_DofHandler[8])(local_30);
  uVar2 = (*dof_handler->_vptr_DofHandler[2])();
  poVar5 = std::operator<<(stream,"DofHandler(");
  uVar3 = (*dof_handler->_vptr_DofHandler[2])();
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
  std::operator<<(poVar5," dofs)");
  if (mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ != 0) {
    std::operator<<(stream,'\n');
    if ((mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         ._4_4_ & 1) == 0) {
      __range5._0_4_ = 0;
      while( true ) {
        peVar6 = std::
                 __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_30);
        uVar3 = (**peVar6->_vptr_Mesh)();
        if (uVar3 < (uint)__range5) break;
        peVar6 = std::
                 __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_30);
        iVar4 = (*peVar6->_vptr_Mesh[2])(peVar6,(ulong)(uint)__range5);
        __begin5._M_current = (Entity **)CONCAT44(extraout_var,iVar4);
        __end5 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                           ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin5
                           );
        e = (Entity *)
            std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                      ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin5);
        while (bVar1 = __gnu_cxx::
                       operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                 (&__end5,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                           *)&e), ((bVar1 ^ 0xffU) & 1) != 0) {
          ppEVar7 = __gnu_cxx::
                    __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                    ::operator*(&__end5);
          entity = *ppEVar7;
          peVar6 = std::
                   __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_30);
          doflist._M_extent._M_extent_value._4_4_ = (*peVar6->_vptr_Mesh[5])(peVar6,entity);
          doflist._M_extent._M_extent_value._0_4_ =
               (*dof_handler->_vptr_DofHandler[3])(dof_handler,entity);
          iVar4 = (*dof_handler->_vptr_DofHandler[5])(dof_handler,entity);
          __range6 = (span<const_long,_18446744073709551615UL> *)CONCAT44(extraout_var_00,iVar4);
          poVar5 = lf::mesh::operator<<(stream,entity);
          poVar5 = std::operator<<(poVar5,' ');
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,doflist._M_extent._M_extent_value._4_4_);
          poVar5 = std::operator<<(poVar5,": ");
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,(uint)doflist._M_extent._M_extent_value);
          std::operator<<(poVar5," dofs = [");
          __end6 = std::span<const_long,_18446744073709551615UL>::begin
                             ((span<const_long,_18446744073709551615UL> *)&__range6);
          dof = (gdof_idx_t *)
                std::span<const_long,_18446744073709551615UL>::end
                          ((span<const_long,_18446744073709551615UL> *)&__range6);
          while (bVar1 = __gnu_cxx::
                         operator==<const_long_*,_std::span<const_long,_18446744073709551615UL>_>
                                   (&__end6,(__normal_iterator<const_long_*,_std::span<const_long,_18446744073709551615UL>_>
                                             *)&dof), ((bVar1 ^ 0xffU) & 1) != 0) {
            intdoflist._M_extent._M_extent_value =
                 (size_t)__gnu_cxx::
                         __normal_iterator<const_long_*,_std::span<const_long,_18446744073709551615UL>_>
                         ::operator*(&__end6);
            poVar5 = (ostream *)
                     std::ostream::operator<<(stream,*(long *)intdoflist._M_extent._M_extent_value);
            std::operator<<(poVar5,' ');
            __gnu_cxx::
            __normal_iterator<const_long_*,_std::span<const_long,_18446744073709551615UL>_>::
            operator++(&__end6);
          }
          std::operator<<(stream,']');
          if (mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._4_4_ % 5 == 0) {
            iVar4 = (*dof_handler->_vptr_DofHandler[6])(dof_handler,entity);
            __range7 = (span<const_long,_18446744073709551615UL> *)CONCAT44(extraout_var_01,iVar4);
            std::operator<<(stream," int = [");
            __end7 = std::span<const_long,_18446744073709551615UL>::begin
                               ((span<const_long,_18446744073709551615UL> *)&__range7);
            int_dof = (gdof_idx_t)
                      std::span<const_long,_18446744073709551615UL>::end
                                ((span<const_long,_18446744073709551615UL> *)&__range7);
            while (bVar1 = __gnu_cxx::
                           operator==<const_long_*,_std::span<const_long,_18446744073709551615UL>_>
                                     (&__end7,(__normal_iterator<const_long_*,_std::span<const_long,_18446744073709551615UL>_>
                                               *)&int_dof), ((bVar1 ^ 0xffU) & 1) != 0) {
              plVar8 = __gnu_cxx::
                       __normal_iterator<const_long_*,_std::span<const_long,_18446744073709551615UL>_>
                       ::operator*(&__end7);
              poVar5 = (ostream *)std::ostream::operator<<(stream,*plVar8);
              std::operator<<(poVar5,' ');
              __gnu_cxx::
              __normal_iterator<const_long_*,_std::span<const_long,_18446744073709551615UL>_>::
              operator++(&__end7);
            }
            std::operator<<(stream,']');
          }
          std::operator<<(stream,'\n');
          __gnu_cxx::
          __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
          ::operator++(&__end5);
        }
        __range5._0_4_ = (uint)__range5 + 1;
      }
    }
    if (mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ % 3 == 0) {
      for (e_1 = (Entity *)0x0; (long)e_1 < (long)(ulong)uVar2;
          e_1 = (Entity *)((long)&e_1->_vptr_Entity + 1)) {
        iVar4 = (*dof_handler->_vptr_DofHandler[7])(dof_handler,e_1);
        poVar5 = std::operator<<(stream,"dof ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(long)e_1);
        poVar5 = std::operator<<(poVar5," -> ");
        poVar5 = lf::mesh::operator<<(poVar5,(Entity *)CONCAT44(extraout_var_02,iVar4));
        poVar5 = std::operator<<(poVar5," ");
        peVar6 = std::
                 __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_30);
        uVar3 = (*peVar6->_vptr_Mesh[5])(peVar6,(Entity *)CONCAT44(extraout_var_02,iVar4));
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
        std::operator<<(poVar5,'\n');
      }
    }
  }
  std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr((shared_ptr<const_lf::mesh::Mesh> *)local_30);
  return;
}

Assistant:

void PrintInfo(std::ostream &stream, const DofHandler &dof_handler,
               unsigned ctrl) {
  // Obtain pointer to the underlying mesh
  auto mesh = dof_handler.Mesh();
  // Number of degrees of freedom managed by the DofHandler object
  const lf::assemble::size_type N_dofs(dof_handler.NumDofs());

  stream << "DofHandler(" << dof_handler.NumDofs() << " dofs)";
  if (ctrl > 0) {
    // More detailed output
    stream << '\n';
    if (ctrl % 2 == 0) {
      for (lf::base::dim_t codim = 0; codim <= mesh->DimMesh(); codim++) {
        // Visit all entities of a specific codimension
        for (const lf::mesh::Entity *e : mesh->Entities(codim)) {
          // Fetch unique index of current entity supplied by mesh object
          const lf::base::glb_idx_t e_idx = mesh->Index(*e);
          // Number of shape functions covering current entity
          const lf::assemble::size_type no_dofs(dof_handler.NumLocalDofs(*e));
          // Obtain global indices of those shape functions ...
          const std::span<const gdof_idx_t> doflist(
              dof_handler.GlobalDofIndices(*e));
          // and print them
          stream << *e << ' ' << e_idx << ": " << no_dofs << " dofs = [";
          for (const lf::assemble::gdof_idx_t &dof : doflist) {
            stream << dof << ' ';
          }
          stream << ']';
          if (ctrl % 5 == 0) {
            // Also output indices of interior shape functions
            const std::span<const gdof_idx_t> intdoflist(
                dof_handler.InteriorGlobalDofIndices(*e));
            stream << " int = [";
            for (const lf::assemble::gdof_idx_t int_dof : intdoflist) {
              stream << int_dof << ' ';
            }
            stream << ']';
          }
          stream << '\n';
        }
      }
    }
    if (ctrl % 3 == 0) {
      // List entities associated wit the dofs managed by the current
      // DofHandler object
      for (lf::assemble::gdof_idx_t dof_idx = 0; dof_idx < N_dofs; dof_idx++) {
        const lf::mesh::Entity &e(dof_handler.Entity(dof_idx));
        stream << "dof " << dof_idx << " -> " << e << " " << mesh->Index(e)
               << '\n';
      }
    }
  }
}